

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O1

void llb_build_key_get_directory_tree_structure_signature_path
               (llb_build_key_t *key,llb_data_t *out_path)

{
  char *pcVar1;
  uint8_t *puVar2;
  StringRef SVar3;
  char *local_38;
  undefined8 local_30;
  char local_28;
  undefined7 uStack_27;
  
  SVar3 = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath((BuildKey *)(key + 0x10));
  pcVar1 = SVar3.Data;
  out_path->length = SVar3.Length;
  local_38 = &local_28;
  if (pcVar1 == (char *)0x0) {
    local_30 = 0;
    local_28 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,pcVar1,pcVar1 + SVar3.Length);
  }
  pcVar1 = local_38;
  puVar2 = (uint8_t *)strdup(local_38);
  out_path->data = puVar2;
  if (pcVar1 != &local_28) {
    operator_delete(pcVar1,CONCAT71(uStack_27,local_28) + 1);
  }
  return;
}

Assistant:

void llb_build_key_get_directory_tree_structure_signature_path(llb_build_key_t *key, llb_data_t *out_path) {
  auto path = ((CAPIBuildKey *)key)->getInternalBuildKey().getFilteredDirectoryPath();
  out_path->length = path.size();
  out_path->data = (const uint8_t*)strdup(path.str().c_str());
}